

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_UnsafeArenaAddAllocated_Test::~ArenaTest_UnsafeArenaAddAllocated_Test
          (ArenaTest_UnsafeArenaAddAllocated_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, UnsafeArenaAddAllocated) {
  Arena arena;
  TestAllTypes* message = Arena::Create<TestAllTypes>(&arena);
  for (int i = 0; i < 10; i++) {
    std::string* arena_string = Arena::Create<std::string>(&arena);
    message->mutable_repeated_string()->UnsafeArenaAddAllocated(arena_string);
    EXPECT_EQ(arena_string, message->mutable_repeated_string(i));
  }
}